

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

Maybe<capnp::SchemaLoader::Impl::RequiredSize_&> __thiscall
kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::find<unsigned_long_const&>
          (HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize> *this,unsigned_long *key)

{
  Maybe<capnp::SchemaLoader::Impl::RequiredSize_&> MVar1;
  long lVar2;
  ArrayPtr<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> table;
  HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>
  local_20 [8];
  long local_18;
  
  table.size_ = *(size_t *)this;
  table.ptr = (Entry *)(this + 0x20);
  HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>::
  find<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,unsigned_long_const&>
            (local_20,table,(unsigned_long *)((long)(*(long *)(this + 8) - *(size_t *)this) >> 4));
  lVar2 = 0;
  if (local_20[0] !=
      (HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>)0x0)
  {
    lVar2 = local_18 * 0x10 + *(long *)this;
  }
  MVar1.ptr = (RequiredSize *)(lVar2 + 8);
  if (lVar2 == 0) {
    MVar1.ptr = (RequiredSize *)0x0;
  }
  return (Maybe<capnp::SchemaLoader::Impl::RequiredSize_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}